

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O3

int Gem_ManFree(Gem_Man_t *p)

{
  Vec_Mem_t *pVVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  
  pVVar1 = p->vTtMem;
  if (pVVar1 == (Vec_Mem_t *)0x0) goto LAB_0048758f;
  pVVar3 = pVVar1->vTable;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      pVVar1->vTable->pArray = (int *)0x0;
      pVVar3 = pVVar1->vTable;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_00487553;
    }
    free(pVVar3);
    pVVar1->vTable = (Vec_Int_t *)0x0;
  }
LAB_00487553:
  pVVar3 = pVVar1->vNexts;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      pVVar1->vNexts->pArray = (int *)0x0;
      pVVar3 = pVVar1->vNexts;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_0048758f;
    }
    free(pVVar3);
    pVVar1->vNexts = (Vec_Int_t *)0x0;
  }
LAB_0048758f:
  pVVar1 = p->vTtMem;
  iVar2 = pVVar1->iPage;
  if (-1 < iVar2) {
    lVar4 = -1;
    do {
      if (pVVar1->ppPages[lVar4 + 1] != (word *)0x0) {
        free(pVVar1->ppPages[lVar4 + 1]);
        pVVar1->ppPages[lVar4 + 1] = (word *)0x0;
        iVar2 = pVVar1->iPage;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  if (pVVar1->ppPages != (word **)0x0) {
    free(pVVar1->ppPages);
  }
  free(pVVar1);
  if (p->pTtElems != (word **)0x0) {
    free(p->pTtElems);
    p->pTtElems = (word **)0x0;
  }
  if (p->pObjs != (Gem_Obj_t *)0x0) {
    free(p->pObjs);
  }
  free(p);
  return 1;
}

Assistant:

int Gem_ManFree( Gem_Man_t * p )
{
    Vec_MemHashFree( p->vTtMem );
    Vec_MemFree( p->vTtMem );
    ABC_FREE( p->pTtElems );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
    return 1;
}